

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-birth.c
# Opt level: O2

void do_cmd_accept_character(command *cmd)

{
  ushort uVar1;
  uint uVar2;
  player_race *ppVar3;
  equip_slot *peVar4;
  start_item *psVar5;
  player_body *ppVar6;
  object *poVar7;
  object *poVar8;
  player_body *ppVar9;
  undefined6 uVar10;
  player *p;
  player_body *ppVar11;
  _Bool _Var12;
  uint32_t uVar13;
  wchar_t wVar14;
  char *pcVar15;
  level_conflict *plVar16;
  equip_slot *peVar17;
  obj_property *poVar18;
  object_kind *poVar19;
  uint *puVar20;
  object *poVar21;
  object *poVar22;
  town *ptVar23;
  ego_item *peVar24;
  byte bVar25;
  player *ppVar26;
  wchar_t wVar27;
  int iVar28;
  ulong uVar29;
  long lVar30;
  start_item **ppsVar31;
  uint8_t uVar32;
  long lVar33;
  char local_88 [88];
  
  options_init_cheat();
  pcVar15 = option_name(0x2a);
  option_set(pcVar15,0);
  iVar28 = (uint)player->hitdie * 0x32 + -0x32;
  lVar30 = 1;
  ppVar26 = player;
  lVar33 = lVar30;
  do {
    for (; lVar33 != 0x32; lVar33 = lVar33 + 1) {
      uVar13 = Rand_div((uint)ppVar26->hitdie);
      ppVar26 = player;
      player->player_hp[lVar33] = (short)uVar13 + player->player_hp[lVar33 + -1] + 1;
    }
    lVar33 = lVar30;
  } while (((int)ppVar26->player_hp[0x31] < (iVar28 * 3) / 8 + 0x32) ||
          ((iVar28 * 5) / 8 + 0x32 < (int)ppVar26->player_hp[0x31]));
  ignore_birth_init();
  ppVar26 = player;
  if ((player->opts).opt[0x2b] == true) {
    plVar16 = level_by_name(world,"Anfauglith 58");
    ppVar26 = player;
    player->place = (int16_t)plVar16->index;
    ppVar26->upkeep->create_stair = FEAT_MORE;
  }
  else {
    player->place = player->home;
  }
  history_clear(ppVar26);
  wVar27 = L'\x01';
  history_add(player,"Began the quest to destroy Morgoth.",L'\x01');
  message_add(" ",0);
  message_add("  ",0);
  message_add("====================",0);
  message_add("  ",0);
  message_add(" ",0);
  ppVar11 = bodies;
  ppVar26 = player;
  ppVar3 = player->race;
  if (ppVar3 == (player_race *)0x0) {
    __assert_fail("p->race",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/player-birth.c"
                  ,0x19e,"void player_embody(struct player *)");
  }
  ppVar6 = bodies[ppVar3->body].next;
  pcVar15 = bodies[ppVar3->body].name;
  ppVar9 = bodies + ppVar3->body;
  uVar10 = *(undefined6 *)&ppVar9->field_0x12;
  peVar17 = *(equip_slot **)(&ppVar9->count + 4);
  (ppVar26->body).count = ppVar9->count;
  *(undefined6 *)&(ppVar26->body).field_0x12 = uVar10;
  (ppVar26->body).slots = peVar17;
  (ppVar26->body).next = ppVar6;
  (ppVar26->body).name = pcVar15;
  my_strcpy(local_88,ppVar11[ppVar3->body].name,0x50);
  pcVar15 = string_make(local_88);
  (ppVar26->body).name = pcVar15;
  peVar17 = (equip_slot *)mem_zalloc((ulong)(ppVar26->body).count << 5);
  (ppVar26->body).slots = peVar17;
  lVar30 = 0;
  for (uVar29 = 0; p = player, uVar29 < (ppVar26->body).count; uVar29 = uVar29 + 1) {
    peVar4 = bodies[ppVar26->race->body].slots;
    *(undefined2 *)((long)&peVar17->type + lVar30) = *(undefined2 *)((long)&peVar4->type + lVar30);
    my_strcpy(local_88,*(char **)((long)&peVar4->name + lVar30),0x50);
    pcVar15 = string_make(local_88);
    peVar17 = (ppVar26->body).slots;
    *(char **)((long)&peVar17->name + lVar30) = pcVar15;
    lVar30 = lVar30 + 0x20;
  }
  uVar1 = z_info->start_gold;
  player->au_birth = (uint)uVar1;
  p->au = (uint)uVar1;
  player_spells_init(p);
  if ((player->opts).opt[0x28] == true) {
    player_learn_all_runes(player);
  }
  poVar22 = player->obj_k;
  poVar22->ac = 1;
  poVar22->to_a = 1;
  poVar22->to_h = 1;
  poVar22->to_d = 1;
  poVar22->dd = '\x01';
  init_race_probs();
  store_reset();
  chunk_list_max = 0;
  player_learn_innate(player);
  seed_randart = Rand_div(0x10000000);
  initialize_random_artifacts(seed_randart);
  deactivate_randart_file();
  seed_flavor = Rand_div(0x10000000);
  flavor_init();
  if ((player->opts).opt[0x29] == true) {
    flavor_set_all_aware();
  }
  ppVar26 = player;
  player->upkeep->total_weight = L'\0';
  poVar22 = ppVar26->obj_k;
  poVar22->dd = '\x01';
  poVar22->ds = '\x01';
  poVar22->ac = 1;
  for (; wVar27 != L'-'; wVar27 = wVar27 + L'\x01') {
    poVar18 = lookup_obj_property(L'\x03',wVar27);
    wVar14 = poVar18->subtype;
    if (wVar14 == L'\x04') {
      flag_on_dbg(ppVar26->obj_k->flags,6,wVar27,"p->obj_k->flags","i");
      wVar14 = poVar18->subtype;
    }
    if (wVar14 == L'\a') {
      flag_on_dbg(ppVar26->obj_k->flags,6,wVar27,"p->obj_k->flags","i");
      wVar14 = poVar18->subtype;
    }
    if (wVar14 == L'\b') {
      flag_on_dbg(ppVar26->obj_k->flags,6,wVar27,"p->obj_k->flags","i");
      wVar14 = poVar18->subtype;
    }
    if (wVar14 == L'\t') {
      flag_on_dbg(ppVar26->obj_k->flags,6,wVar27,"p->obj_k->flags","i");
    }
  }
  ppsVar31 = &ppVar26->class->start_items;
  do {
    psVar5 = *ppsVar31;
    if (psVar5 == (start_item *)0x0) {
      if ((ppVar26->opts).opt[0x2b] == true) {
        poVar21 = object_new();
        wVar27 = lookup_sval(L'\x14',"Amethyst");
        poVar19 = lookup_kind(L'\x14',wVar27);
        object_prep(poVar21,poVar19,L'\0',MINIMISE);
        poVar21->modifiers[0x10] = 4;
        flag_on_dbg(poVar21->flags,6,0xd,"obj->flags","OF_TELEPATHY");
        poVar21->origin = '\x12';
        poVar22 = object_new();
        poVar21->known = poVar22;
        object_set_base_known(ppVar26,poVar21);
        object_flavor_aware(ppVar26,poVar21);
        poVar22 = poVar21->known;
        poVar22->pval = poVar21->pval;
        poVar22->effect = poVar21->effect;
        poVar22->notice = poVar22->notice | 2;
        inven_carry(ppVar26,poVar21,true,false);
        poVar19->everseen = true;
        poVar21 = object_new();
        wVar27 = lookup_sval(L'\x18',"Detection");
        poVar19 = lookup_kind(L'\x18',wVar27);
        object_prep(poVar21,poVar19,L'\0',MINIMISE);
        poVar21->origin = '\x12';
        poVar22 = object_new();
        poVar21->known = poVar22;
        object_set_base_known(ppVar26,poVar21);
        object_flavor_aware(ppVar26,poVar21);
        poVar22 = poVar21->known;
        poVar22->pval = poVar21->pval;
        poVar22->effect = poVar21->effect;
        poVar22->notice = poVar22->notice | 2;
        inven_carry(ppVar26,poVar21,true,false);
        poVar19->everseen = true;
        poVar21 = object_new();
        wVar27 = lookup_sval(L'\x18',"Magic Mapping");
        poVar19 = lookup_kind(L'\x18',wVar27);
        object_prep(poVar21,poVar19,L'\0',MINIMISE);
        poVar21->origin = '\x12';
        poVar22 = object_new();
        poVar21->known = poVar22;
        object_set_base_known(ppVar26,poVar21);
        object_flavor_aware(ppVar26,poVar21);
        poVar22 = poVar21->known;
        poVar22->pval = poVar21->pval;
        poVar22->effect = poVar21->effect;
        poVar22->notice = poVar22->notice | 2;
        inven_carry(ppVar26,poVar21,true,false);
        poVar19->everseen = true;
        poVar21 = object_new();
        wVar27 = lookup_sval(L'\x19',"*Destruction*");
        poVar19 = lookup_kind(L'\x19',wVar27);
        object_prep(poVar21,poVar19,L'\0',MINIMISE);
        poVar21->number = '\x05';
        poVar21->origin = '\x12';
        poVar22 = object_new();
        poVar21->known = poVar22;
        object_set_base_known(ppVar26,poVar21);
        object_flavor_aware(ppVar26,poVar21);
        poVar22 = poVar21->known;
        poVar22->pval = poVar21->pval;
        poVar22->effect = poVar21->effect;
        poVar22->notice = poVar22->notice | 2;
        inven_carry(ppVar26,poVar21,true,false);
        poVar19->everseen = true;
        poVar21 = object_new();
        wVar27 = lookup_sval(L'\x19',"Identify Rune");
        poVar19 = lookup_kind(L'\x19',wVar27);
        object_prep(poVar21,poVar19,L'\0',MINIMISE);
        poVar21->number = '\x0f';
        poVar21->origin = '\x12';
        poVar22 = object_new();
        poVar21->known = poVar22;
        object_set_base_known(ppVar26,poVar21);
        object_flavor_aware(ppVar26,poVar21);
        poVar22 = poVar21->known;
        poVar22->pval = poVar21->pval;
        poVar22->effect = poVar21->effect;
        poVar22->notice = poVar22->notice | 2;
        inven_carry(ppVar26,poVar21,true,false);
        poVar19->everseen = true;
      }
      if (ppVar26->au < 0) {
        ppVar26->au = 0;
      }
      wield_all(ppVar26);
      wVar27 = slot_by_name(player,"weapon");
      poVar22 = slot_object(player,wVar27);
      ptVar23 = town_by_name(world,ppVar26->race->hometown);
      if ((((poVar22 != (object *)0x0) && (player->home != 0)) && (ptVar23 != (town *)0x0)) &&
         (ptVar23->ego != (char *)0x0)) {
        peVar24 = lookup_ego_item(ptVar23->ego,(uint)poVar22->tval,(uint)poVar22->sval);
        if (peVar24 != (ego_item *)0x0) {
          poVar21 = poVar22->known;
          poVar7 = poVar22->prev;
          poVar8 = poVar22->next;
          object_prep(poVar22,poVar22->kind,(int)ppVar26->depth,MINIMISE);
          poVar22->ego = peVar24;
          poVar22->prev = poVar7;
          poVar22->next = poVar8;
          poVar22->known = poVar21;
          ego_apply_magic(poVar22,(int)ppVar26->depth,MINIMISE);
          player_know_object(ppVar26,poVar22);
          while( true ) {
            _Var12 = object_fully_known(poVar22);
            if (_Var12) break;
            object_learn_unknown_rune(ppVar26,poVar22,false);
          }
        }
      }
      update_player_object_knowledge(ppVar26);
      get_bonuses();
      ppVar26 = player;
      player->is_dead = false;
      character_generated = true;
      ppVar26->upkeep->playing = true;
      cmd_disable_repeat();
      string_free(prev.history);
      prev.history = (char *)0x0;
      string_free(quickstart_prev.history);
      quickstart_prev.history = (char *)0x0;
      event_signal(EVENT_LEAVE_BIRTH);
      return;
    }
    iVar28 = rand_range(psVar5->min,psVar5->max);
    poVar19 = lookup_kind(psVar5->tval,psVar5->sval);
    if (poVar19 == (object_kind *)0x0) {
      __assert_fail("kind",
                    "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/player-birth.c"
                    ,0x2ad,"void player_outfit(struct player *)");
    }
    uVar32 = (uint8_t)iVar28;
    if (((ppVar26->opts).opt[0x26] == false) && ((ppVar26->opts).opt[0x2b] == false)) {
      _Var12 = tval_is_food_k(poVar19);
      uVar32 = '\x01';
      if (_Var12) goto LAB_001a9cc1;
      _Var12 = tval_is_light_k(poVar19);
      if (_Var12) goto LAB_001a9cc1;
    }
    else {
LAB_001a9cc1:
      puVar20 = (uint *)psVar5->eopts;
      if (puVar20 != (uint *)0x0) {
        bVar25 = 1;
        while( true ) {
          uVar2 = *puVar20;
          if (((ulong)uVar2 == 0) || ((bVar25 & 1) == 0)) break;
          if ((int)uVar2 < 1) {
            bVar25 = (ppVar26->opts).opt[-uVar2];
          }
          else {
            bVar25 = (ppVar26->opts).opt[uVar2] ^ 1;
          }
          puVar20 = puVar20 + 1;
        }
        if ((bVar25 & 1) == 0) goto LAB_001a9d98;
      }
      poVar21 = object_new();
      object_prep(poVar21,poVar19,L'\0',MINIMISE);
      poVar21->number = uVar32;
      poVar21->origin = '\x12';
      poVar22 = object_new();
      poVar21->known = poVar22;
      object_set_base_known(ppVar26,poVar21);
      object_flavor_aware(ppVar26,poVar21);
      poVar22 = poVar21->known;
      poVar22->pval = poVar21->pval;
      poVar22->effect = poVar21->effect;
      poVar22->notice = poVar22->notice | 2;
      wVar27 = object_value_real(poVar21,(uint)poVar21->number);
      ppVar26->au = ppVar26->au - wVar27;
      inven_carry(ppVar26,poVar21,true,false);
      poVar19->everseen = true;
    }
LAB_001a9d98:
    ppsVar31 = &psVar5->next;
  } while( true );
}

Assistant:

void do_cmd_accept_character(struct command *cmd)
{
	options_init_cheat();

	/* Turn off persistent levels, for now */
	option_set(option_name(OPT_birth_levels_persist), 0);

	roll_hp();

	ignore_birth_init();

	/* Handle player placement */
	if (OPT(player, birth_thrall)) {
		player->place = level_by_name(world, "Anfauglith 58")->index;
		player->upkeep->create_stair = FEAT_MORE;
	} else {
		player->place = player->home;
	}

	/* Clear old messages, add new starting message */
	history_clear(player);
	history_add(player, "Began the quest to destroy Morgoth.", HIST_PLAYER_BIRTH);

	/* Note player birth in the message recall */
	message_add(" ", MSG_GENERIC);
	message_add("  ", MSG_GENERIC);
	message_add("====================", MSG_GENERIC);
	message_add("  ", MSG_GENERIC);
	message_add(" ", MSG_GENERIC);

	/* Embody */
	player_embody(player);

	/* Give the player some money */
	get_money(player);

	/* Initialise the spells */
	player_spells_init(player);

	/* Know all runes for ID on walkover */
	if (OPT(player, birth_know_runes))
		player_learn_all_runes(player);

	/* Hack - player knows all combat runes.  Maybe make them not runes? NRM */
	player->obj_k->to_a = 1;
	player->obj_k->to_h = 1;
	player->obj_k->to_d = 1;
	player->obj_k->ac = 1;
	player->obj_k->dd = 1;

	/* Initialise the stores, dungeon */
	init_race_probs();
	store_reset();
	chunk_list_max = 0;

	/* Player learns innate runes */
	player_learn_innate(player);

	/* Generate random artifacts */
	seed_randart = randint0(0x10000000);
	initialize_random_artifacts(seed_randart);
	deactivate_randart_file();

	/* Seed for flavors */
	seed_flavor = randint0(0x10000000);
	flavor_init();

	/* Know all flavors for auto-ID of consumables */
	if (OPT(player, birth_know_flavors))
		flavor_set_all_aware();

	/* Outfit the player, if they can sell the stuff */
	player_outfit(player);

	/* Max HP and SP */
	get_bonuses();

	/* Stop the player being quite so dead */
	player->is_dead = false;

	/* Character is now "complete" */
	character_generated = true;
	player->upkeep->playing = true;

	/* Disable repeat command, so we don't try to be born again */
	cmd_disable_repeat();

	/* No longer need the cached history. */
	string_free(prev.history);
	prev.history = NULL;
	string_free(quickstart_prev.history);
	quickstart_prev.history = NULL;

	/* Now we're really done.. */
	event_signal(EVENT_LEAVE_BIRTH);
}